

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

int __thiscall smf::Options::storeOption(Options *this,int gargp,int *position,int *running)

{
  pointer pbVar1;
  bool bVar2;
  int *piVar3;
  char cVar4;
  int iVar5;
  pointer pcVar6;
  long lVar7;
  char *pcVar8;
  ostream *poVar9;
  long lVar10;
  long lVar11;
  allocator local_48a;
  allocator local_489;
  int *local_488;
  long local_480;
  string local_478;
  string local_458;
  char tempname [1024];
  
  lVar10 = (long)gargp;
  local_488 = running;
  if (*running == 0) {
    lVar11 = (long)gargp;
    pbVar1 = (this->m_oargv).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar6 = pbVar1[lVar11]._M_dataplus._M_p;
    local_480 = lVar11;
    if (pcVar6[1] == this->m_optionFlag) {
      lVar10 = 2;
      lVar7 = 0;
      while( true ) {
        *position = (int)lVar10;
        cVar4 = pcVar6[lVar10];
        if ((cVar4 == '\0') || (cVar4 == '=')) break;
        tempname[lVar10 + -2] = cVar4;
        lVar10 = lVar10 + 1;
        pcVar6 = pbVar1[lVar11]._M_dataplus._M_p;
        lVar7 = lVar7 + 0x100000000;
      }
      tempname[lVar7 >> 0x20] = '\0';
      std::__cxx11::string::string((string *)&local_478,tempname,(allocator *)&local_458);
      cVar4 = getType(this,&local_478);
      std::__cxx11::string::~string((string *)&local_478);
      if (cVar4 == -1) {
        this->m_optionsArgument = 1;
        goto LAB_001123b9;
      }
      if ((this->m_oargv).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar11]._M_dataplus._M_p[*position] == '=') {
        if (cVar4 == 'b') {
          poVar9 = std::operator<<((ostream *)&std::cerr,
                                   "Error: boolean variable cannot have any options: ");
          pcVar8 = tempname;
          goto LAB_001123ed;
        }
        *position = *position + 1;
      }
      bVar2 = false;
      lVar10 = local_480;
    }
    else {
      *position = 1;
      tempname[0] = pcVar6[1];
      tempname[1] = '\0';
      std::__cxx11::string::string((string *)&local_478,tempname,(allocator *)&local_458);
      cVar4 = getType(this,&local_478);
      std::__cxx11::string::~string((string *)&local_478);
      if (cVar4 != 'b') goto LAB_0011224f;
      bVar2 = true;
      cVar4 = 'b';
      lVar10 = local_480;
    }
  }
  else {
    iVar5 = *position;
    *position = iVar5 + 1;
    tempname[0] = (this->m_oargv).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar10]._M_dataplus._M_p
                  [(long)iVar5 + 1];
    tempname[1] = '\0';
    std::__cxx11::string::string((string *)&local_478,tempname,(allocator *)&local_458);
    cVar4 = getType(this,&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    if (cVar4 == 'b') {
      bVar2 = true;
      cVar4 = 'b';
    }
    else {
      *local_488 = 0;
LAB_0011224f:
      *position = *position + 1;
      if (cVar4 == -1) {
LAB_001123b9:
        this->m_optionsArgument = 1;
        *position = 0;
        return gargp + 1;
      }
      bVar2 = true;
    }
  }
  piVar3 = local_488;
  pbVar1 = (this->m_oargv).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar5 = *position;
  if ((cVar4 != 'b') && (pbVar1[lVar10]._M_dataplus._M_p[iVar5] == '\0')) {
    gargp = gargp + 1;
    *position = 0;
    iVar5 = 0;
  }
  if (bVar2 && cVar4 == 'b') {
    pcVar6 = pbVar1[gargp]._M_dataplus._M_p;
    if (pcVar6[(long)iVar5 + 1] == '\0') {
LAB_00112334:
      if (pcVar6[(long)iVar5 + 1] != '\0') goto LAB_00112341;
      iVar5 = 0;
    }
    else {
      iVar5 = 1;
    }
    *local_488 = iVar5;
  }
  else if (cVar4 == 'b') {
    pcVar6 = pbVar1[gargp]._M_dataplus._M_p;
    goto LAB_00112334;
  }
LAB_00112341:
  if (gargp < this->m_oargc) {
    std::__cxx11::string::string((string *)&local_478,tempname,&local_489);
    std::__cxx11::string::string
              ((string *)&local_458,
               (this->m_oargv).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[gargp]._M_dataplus._M_p + *position,
               &local_48a);
    setModified(this,&local_478,&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_478);
    return gargp + (uint)(*piVar3 == 0);
  }
  poVar9 = (ostream *)&std::cerr;
  pcVar8 = "Error: last option requires a parameter";
LAB_001123ed:
  poVar9 = std::operator<<(poVar9,pcVar8);
  std::endl<char,std::char_traits<char>>(poVar9);
  exit(1);
}

Assistant:

int Options::storeOption(int gargp, int& position, int& running) {
   int optionForm;
   char tempname[1024];
   char optionType = '\0';

   if (running) {
      optionForm = OPTION_FORM_CONTINUE;
   } else if (m_oargv[gargp][1] == getFlag()) {
      optionForm = OPTION_FORM_LONG;
   } else {
      optionForm = OPTION_FORM_SHORT;
   }

   switch (optionForm) {
      case OPTION_FORM_CONTINUE:
         position++;
         tempname[0] = m_oargv[gargp][position];
         tempname[1] = '\0';
         optionType = getType(tempname);
         if (optionType != OPTION_BOOLEAN_TYPE) {
            running = 0;
            position++;
         }
         break;
      case OPTION_FORM_SHORT:
         position = 1;
         tempname[0] = m_oargv[gargp][position];
         tempname[1] = '\0';
         optionType = getType(tempname);
         if (optionType != OPTION_BOOLEAN_TYPE) {
            position++;
         }
         break;
      case OPTION_FORM_LONG:
         position = 2;
         while (m_oargv[gargp][position] != '=' &&
               m_oargv[gargp][position] != '\0') {
            tempname[position-2] = m_oargv[gargp][position];
            position++;
         }
         tempname[position-2] = '\0';
         optionType = getType(tempname);
         if (optionType == -1) {         // suppressed --options option
            m_optionsArgument = 1;
            break;
         }
         if (m_oargv[gargp][position] == '=') {
            if (optionType == OPTION_BOOLEAN_TYPE) {
               std::cerr << "Error: boolean variable cannot have any options: "
                    << tempname << std::endl;
               exit(1);
            }
            position++;
         }
         break;
   }

   if (optionType == -1) {              // suppressed --options option
      m_optionsArgument = 1;
      gargp++;
      position = 0;
      return gargp;
   }

   if (m_oargv[gargp][position] == '\0' &&
         optionType != OPTION_BOOLEAN_TYPE) {
      gargp++;
      position = 0;
   }

   if (optionForm != OPTION_FORM_LONG && optionType == OPTION_BOOLEAN_TYPE &&
         m_oargv[gargp][position+1] != '\0') {
      running = 1;
   } else if (optionType == OPTION_BOOLEAN_TYPE &&
         m_oargv[gargp][position+1] == '\0') {
      running = 0;
   }

   if (gargp >= m_oargc) {
      std::cerr << "Error: last option requires a parameter" << std::endl;
      exit(1);
   }
   setModified(tempname, &m_oargv[gargp][position]);

   if (!running) {
      gargp++;
   }
   return gargp;
}